

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O2

void __thiscall Server::~Server(Server *this)

{
  list<Client_*,_std::allocator<Client_*>_> *this_00;
  long *plVar1;
  _List_node_base *p_Var2;
  
  this->_vptr_Server = (_func_int **)&PTR_ClientFactory_001bcbd8;
  this_00 = &this->clients;
  p_Var2 = (_List_node_base *)this_00;
  while (p_Var2 = (((_List_base<Client_*,_std::allocator<Client_*>_> *)&p_Var2->_M_next)->_M_impl).
                  _M_node.super__List_node_base._M_next, p_Var2 != (_List_node_base *)this_00) {
    plVar1 = (long *)p_Var2[1]._M_next;
    close(*(int *)plVar1[1]);
    (**(code **)(*plVar1 + 0x10))(plVar1);
  }
  close(this->impl->sock);
  operator_delete(this->impl,0x188);
  std::__cxx11::_List_base<Client_*,_std::allocator<Client_*>_>::_M_clear
            (&this_00->super__List_base<Client_*,_std::allocator<Client_*>_>);
  return;
}

Assistant:

Server::~Server()
{
	UTIL_FOREACH(this->clients, client)
	{
#ifdef WIN32
		closesocket(client->impl->sock);
#else // WIN32
		close(client->impl->sock);
#endif // WIN32
		delete client;
	}

#ifdef WIN32
	closesocket(this->impl->sock);
#else // WIN32
	close(this->impl->sock);
#endif // WIN32

	delete this->impl;
}